

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLExportTest_writeValueArrayTest_Test::TestBody
          (OpenDDLExportTest_writeValueArrayTest_Test *this)

{
  DataArrayList *pDVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_218;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_198;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__2;
  Message local_170;
  uint local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_148;
  Message local_140;
  ValueType local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  char *in;
  DataArrayList *pDStack_110;
  ValueType type;
  DataArrayList *dataArrayList;
  char *end;
  size_t len;
  char token [30];
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  undefined1 local_48 [8];
  string statement;
  undefined1 local_20 [7];
  bool ok;
  OpenDDLExportMock myExporter;
  OpenDDLExportTest_writeValueArrayTest_Test *this_local;
  
  myExporter.super_OpenDDLExport.m_stream = (IOStreamBase *)this;
  OpenDDLExportMock::OpenDDLExportMock((OpenDDLExportMock *)local_20);
  statement.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::string((string *)local_48);
  statement.field_2._M_local_buf[0xf] =
       OpenDDLExportMock::writeValueArrayTester
                 ((OpenDDLExportMock *)local_20,(DataArrayList *)0x0,(string *)local_48);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_68,(bool)(~statement.field_2._M_local_buf[0xf] & 1));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_68,(AssertionResult *)"ok","true",
               "false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x11e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  bVar2 = (bool)std::__cxx11::string::empty();
  testing::AssertionResult::AssertionResult((AssertionResult *)local_a8,bVar2);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(token + 0x18),(internal *)local_a8,(AssertionResult *)"statement.empty()",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)(token + 0x18));
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  builtin_strncpy(token + 8," {1, 2, 3}\n}\n",0xe);
  len = 0x33205b74616f6c66;
  builtin_strncpy(token," ]\n{\n   ",8);
  end = (char *)0x0;
  dataArrayList = (DataArrayList *)findEnd((char *)&len,(size_t *)&end);
  pDStack_110 = (DataArrayList *)0x0;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       OpenDDLParser::parsePrimitiveDataType
                 ((char *)&len,(char *)dataArrayList,(ValueType *)((long)&in + 4),(size_t *)&end);
  local_134 = ddl_float;
  testing::internal::EqHelper<false>::
  Compare<ODDLParser::Value::ValueType,ODDLParser::Value::ValueType>
            ((EqHelper<false> *)local_130,"Value::ValueType::ddl_float","type",&local_134,
             (ValueType *)((long)&in + 4));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x12d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_164 = 3;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_160,"3U","len",&local_164,(unsigned_long *)&end);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar2) {
      testing::Message::Message(&local_170);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
                 ,0x12e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_170);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OpenDDLParser::parseDataArrayList
                     (gtest_ar.message_.ptr_,(char *)dataArrayList,in._4_4_,&stack0xfffffffffffffef0
                     );
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)local_188,pDStack_110 != (DataArrayList *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar2) {
        testing::Message::Message(&local_190);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_188,
                   (AssertionResult *)"nullptr == dataArrayList","true","false",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_198,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
                   ,0x130,pcVar3);
        testing::internal::AssertHelper::operator=(&local_198,&local_190);
        testing::internal::AssertHelper::~AssertHelper(&local_198);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_190);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        statement.field_2._M_local_buf[0xf] =
             OpenDDLExportMock::writeValueArrayTester
                       ((OpenDDLExportMock *)local_20,pDStack_110,(string *)local_48);
        testing::AssertionResult::AssertionResult
                  ((AssertionResult *)local_1c8,(bool)statement.field_2._M_local_buf[0xf]);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
        if (!bVar2) {
          testing::Message::Message(&local_1d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_2.message_,(internal *)local_1c8,(AssertionResult *)"ok",
                     "false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
                     ,0x133,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
          testing::internal::AssertHelper::~AssertHelper(&local_1d8);
          std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_1d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
        testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
                  ((EqHelper<false> *)local_208,"\"{ 1, 2, 3 }\"","statement",
                   (char (*) [12])"{ 1, 2, 3 }",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
        if (!bVar2) {
          testing::Message::Message(&local_210);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
          testing::internal::AssertHelper::AssertHelper
                    (&local_218,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
                     ,0x134,pcVar3);
          testing::internal::AssertHelper::operator=(&local_218,&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_218);
          testing::Message::~Message(&local_210);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
        pDVar1 = pDStack_110;
        if (pDStack_110 != (DataArrayList *)0x0) {
          DataArrayList::~DataArrayList(pDStack_110);
          operator_delete(pDVar1,0x28);
        }
        gtest_ar_1.message_.ptr_._4_4_ = 0;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  OpenDDLExportMock::~OpenDDLExportMock((OpenDDLExportMock *)local_20);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeValueArrayTest) {
    OpenDDLExportMock myExporter;
    bool ok(true);
    std::string statement;
    ok = myExporter.writeValueArrayTester(nullptr, statement);
    EXPECT_FALSE(ok);
    EXPECT_TRUE(statement.empty());

    char token[] =
            "float[ 3 ]\n"
            "{\n"
            "    {1, 2, 3}\n"
            "}\n";

    size_t len(0);
    char *end = findEnd(token, len);
    DataArrayList *dataArrayList = nullptr;
    Value::ValueType type;

    char *in = OpenDDLParser::parsePrimitiveDataType(token, end, type, len);
    ASSERT_EQ(Value::ValueType::ddl_float, type);
    ASSERT_EQ(3U, len);
    in = OpenDDLParser::parseDataArrayList(in, end, type, &dataArrayList);
    ASSERT_FALSE(nullptr == dataArrayList);

    ok = myExporter.writeValueArrayTester(dataArrayList, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("{ 1, 2, 3 }", statement);
    delete dataArrayList;
}